

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

int align_buffer_end(flatcc_builder_t *B,uint16_t *align,uint16_t block_align,int is_nested)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined6 in_register_00000012;
  flatcc_iovec_t local_88 [8];
  
  uVar4 = (uint)CONCAT62(in_register_00000012,block_align);
  if (uVar4 == 0) {
    uVar4 = *(int *)&B->block_align + (uint)((short)*(int *)&B->block_align == 0);
  }
  uVar1 = *align;
  uVar3 = 4;
  if (4 < uVar1) {
    uVar3 = (uint)uVar1;
  }
  uVar2 = uVar4;
  if ((ushort)uVar4 < (ushort)uVar3) {
    uVar2 = uVar3;
  }
  if (uVar1 < 4 || (ushort)uVar3 < (ushort)uVar4) {
    *align = (uint16_t)uVar2;
  }
  if (is_nested == 0) {
    uVar4 = B->emit_end;
    uVar3 = (uVar2 & 0xffff) - 1 & uVar4;
    if (uVar3 != 0) {
      local_88[0].iov_len = (size_t)uVar3;
      local_88[0].iov_base = "";
      B->emit_end = uVar3 + uVar4;
      uVar3 = (*B->emit)(B->emit_context,local_88,1,uVar4,local_88[0].iov_len);
      B = (flatcc_builder_t *)(ulong)uVar3;
      if (uVar3 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                      ,0x2b3,
                      "flatcc_builder_ref_t emit_back(flatcc_builder_t *, flatcc_iov_state_t *)");
      }
      if (uVar4 == 0xffffffff) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                      ,0x2cd,"int align_buffer_end(flatcc_builder_t *, uint16_t *, uint16_t, int)");
      }
    }
  }
  return (int)B;
}

Assistant:

static int align_buffer_end(flatcc_builder_t *B, uint16_t *align, uint16_t block_align, int is_nested)
{
    size_t end_pad;
    iov_state_t iov;

    block_align = block_align ? block_align : B->block_align ? B->block_align : 1;
    get_min_align(align, field_size);
    get_min_align(align, block_align);
    /* Pad end of buffer to multiple. */
    if (!is_nested) {
        end_pad = back_pad(B, *align);
        if (end_pad) {
            init_iov();
            push_iov(_pad, end_pad);
            if (0 == emit_back(B, &iov)) {
                check(0, "emitter rejected buffer content");
                return -1;
            }
        }
    }
    return 0;
}